

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

unsigned_long_long GetTickMS(void)

{
  unsigned_long_long u;
  timeval now;
  
  memset(&u,0,0x10);
  gettimeofday((timeval *)&u,(__timezone_ptr_t)0x0);
  return now.tv_sec / 1000 + u * 1000;
}

Assistant:

static unsigned long long GetTickMS()
{
#if defined( __LIBCO_RDTSCP__) 
	static uint32_t khz = getCpuKhz();
	return counter() / khz;
#else
	struct timeval now = { 0 };
	gettimeofday( &now,NULL );
	unsigned long long u = now.tv_sec;
	u *= 1000;
	u += now.tv_usec / 1000;
	return u;
#endif
}